

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O2

void __thiscall
TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeQuad>_>::TPZCompElWithMem
          (TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeQuad>_> *this,TPZCompMesh *mesh,
          TPZGeoEl *gel)

{
  *(undefined ***)
   &(this->super_TPZCompElH1<pzshape::TPZShapeQuad>).super_TPZIntelGen<pzshape::TPZShapeQuad>.
    super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl =
       &PTR__TPZSavable_01763000;
  TPZCompElH1<pzshape::TPZShapeQuad>::TPZCompElH1
            (&this->super_TPZCompElH1<pzshape::TPZShapeQuad>,&PTR_PTR_01761cb8,mesh,gel,EH1Standard)
  ;
  *(undefined ***)
   &(this->super_TPZCompElH1<pzshape::TPZShapeQuad>).super_TPZIntelGen<pzshape::TPZShapeQuad>.
    super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl =
       &PTR__TPZCompElWithMem_017618e8;
  TPZStack<long,_128>::TPZStack(&this->fIntPtIndices);
  (**(code **)(*(long *)&(this->super_TPZCompElH1<pzshape::TPZShapeQuad>).
                         super_TPZIntelGen<pzshape::TPZShapeQuad>.super_TPZInterpolatedElement.
                         super_TPZInterpolationSpace.super_TPZCompEl + 0x168))(this);
  return;
}

Assistant:

TPZCompElWithMem<TBASE>::TPZCompElWithMem(TPZCompMesh &mesh, TPZGeoEl *gel) :
TPZRegisterClassId(&TPZCompElWithMem::ClassId),
TBASE(mesh, gel){
    PrepareIntPtIndices();
}